

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void gen_b64grams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  uint __args;
  function<void_(unsigned_int)> *in_RSI;
  long in_RDI;
  int next;
  uint64_t offset;
  uint64_t good_run;
  uint32_t gram4;
  function<void_(unsigned_int)> *this;
  ulong local_28;
  
  if ((function<void_(unsigned_int)> *)0x3 < in_RSI) {
    local_28 = 0;
    for (this = (function<void_(unsigned_int)> *)0x0; this < in_RSI;
        this = (function<void_(unsigned_int)> *)((long)&(this->super__Function_base)._M_functor + 1)
        ) {
      __args = get_b64_value((this->super__Function_base)._M_functor._M_pod_data[in_RDI]);
      if ((int)__args < 0) {
        local_28 = 0;
      }
      else {
        local_28 = local_28 + 1;
      }
      if (3 < local_28) {
        std::function<void_(unsigned_int)>::operator()(this,__args);
      }
    }
  }
  return;
}

Assistant:

void gen_b64grams(const uint8_t *mem, uint64_t size,
                  const TrigramCallback &cb) {
    if (size < 4) {
        return;
    }

    uint32_t gram4 = 0;
    uint64_t good_run = 0;

    for (uint64_t offset = 0; offset < size; offset++) {
        int next = get_b64_value(mem[offset]);
        if (next < 0) {
            good_run = 0;
        } else {
            gram4 = ((gram4 << 6U) + next) & 0xFFFFFFU;
            good_run += 1;
        }
        if (good_run >= 4) {
            cb(gram4);
        }
    }
}